

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::DeconvolutionDepthWise::load_param(DeconvolutionDepthWise *this,ParamDict *pd)

{
  void *__ptr;
  Allocator *pAVar1;
  int iVar2;
  int *piVar3;
  Mat local_98;
  Mat local_58;
  
  iVar2 = ParamDict::get(pd,0,0);
  this->num_output = iVar2;
  iVar2 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar2;
  iVar2 = ParamDict::get(pd,0xb,iVar2);
  this->kernel_h = iVar2;
  iVar2 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar2;
  iVar2 = ParamDict::get(pd,0xc,iVar2);
  this->dilation_h = iVar2;
  iVar2 = ParamDict::get(pd,3,1);
  this->stride_w = iVar2;
  iVar2 = ParamDict::get(pd,0xd,iVar2);
  this->stride_h = iVar2;
  iVar2 = ParamDict::get(pd,4,0);
  this->pad_left = iVar2;
  iVar2 = ParamDict::get(pd,0xf,iVar2);
  this->pad_right = iVar2;
  iVar2 = ParamDict::get(pd,0xe,this->pad_left);
  this->pad_top = iVar2;
  iVar2 = ParamDict::get(pd,0x10,iVar2);
  this->pad_bottom = iVar2;
  iVar2 = ParamDict::get(pd,0x12,0);
  this->output_pad_right = iVar2;
  iVar2 = ParamDict::get(pd,0x13,iVar2);
  this->output_pad_bottom = iVar2;
  iVar2 = ParamDict::get(pd,0x14,0);
  this->output_w = iVar2;
  iVar2 = ParamDict::get(pd,0x15,iVar2);
  this->output_h = iVar2;
  iVar2 = ParamDict::get(pd,5,0);
  this->bias_term = iVar2;
  iVar2 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar2;
  iVar2 = ParamDict::get(pd,7,1);
  this->group = iVar2;
  iVar2 = ParamDict::get(pd,9,0);
  this->activation_type = iVar2;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,10,&local_58);
  piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (&this->activation_params != &local_98) {
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->activation_params).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        __ptr = (this->activation_params).data;
        pAVar1 = (this->activation_params).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar1 + 0x18))();
        }
      }
    }
    (this->activation_params).data = local_98.data;
    piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->activation_params).refcount = piVar3;
    (this->activation_params).elemsize =
         CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->activation_params).elempack = local_98.elempack;
    (this->activation_params).allocator = local_98.allocator;
    (this->activation_params).dims = local_98.dims;
    (this->activation_params).w = local_98.w;
    (this->activation_params).h = local_98.h;
    (this->activation_params).c = local_98.c;
    (this->activation_params).cstep = local_98.cstep;
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar3 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    output_pad_right = pd.get(18, 0);
    output_pad_bottom = pd.get(19, output_pad_right);
    output_w = pd.get(20, 0);
    output_h = pd.get(21, output_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    return 0;
}